

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_vox.cpp
# Opt level: O0

bool demo_load_and_save(char *filename)

{
  ogt_vox_group *poVar1;
  ogt_vox_model *model_00;
  uint32_t uVar2;
  ogt_vox_scene *scene_00;
  ogt_vox_layer *poVar3;
  ogt_vox_instance *poVar4;
  char *pcVar5;
  char *in_stack_ffffffffffffff20;
  undefined4 uVar6;
  char *local_d0;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  ogt_vox_layer *local_98;
  char *local_90;
  uint32_t total_voxel_count;
  uint32_t solid_voxel_count;
  ogt_vox_model *model_1;
  uint32_t model_index;
  char *layer_name;
  ogt_vox_model *model;
  ogt_vox_instance *instance;
  uint32_t instance_index;
  ogt_vox_layer *group_layer;
  ogt_vox_group *group;
  uint32_t group_index;
  ogt_vox_layer *layer;
  uint32_t layer_index;
  ogt_vox_scene *scene;
  char *filename_local;
  
  scene_00 = load_vox_scene_with_groups(filename);
  if (scene_00 == (ogt_vox_scene *)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
    filename_local._7_1_ = false;
  }
  else {
    printf("#layers: %u\n",(ulong)scene_00->num_layers);
    for (layer._4_4_ = 0; layer._4_4_ < scene_00->num_layers; layer._4_4_ = layer._4_4_ + 1) {
      poVar3 = scene_00->layers + layer._4_4_;
      if (poVar3->name == (char *)0x0) {
        local_90 = "";
      }
      else {
        local_90 = poVar3->name;
      }
      pcVar5 = "shown";
      if ((poVar3->hidden & 1U) != 0) {
        pcVar5 = "hidden";
      }
      printf("layer[%u,name=%s] is %s\n",(ulong)layer._4_4_,local_90,pcVar5);
    }
    printf("#groups: %u\n",(ulong)scene_00->num_groups);
    for (group._4_4_ = 0; group._4_4_ < scene_00->num_groups; group._4_4_ = group._4_4_ + 1) {
      poVar1 = scene_00->groups;
      if (poVar1[group._4_4_].layer_index == 0xffffffff) {
        local_98 = (ogt_vox_layer *)0x0;
      }
      else {
        local_98 = scene_00->layers + poVar1[group._4_4_].layer_index;
      }
      if ((local_98 == (ogt_vox_layer *)0x0) || (local_98->name == (char *)0x0)) {
        local_b0 = "";
      }
      else {
        local_b0 = local_98->name;
      }
      pcVar5 = "shown";
      if ((poVar1[group._4_4_].hidden & 1U) != 0) {
        pcVar5 = "hidden";
      }
      printf("group[%u] has parent group %u, is part of layer[%u,name=%s] and is %s\n",
             (ulong)group._4_4_,(ulong)poVar1[group._4_4_].parent_group_index,
             (ulong)poVar1[group._4_4_].layer_index,local_b0,pcVar5);
    }
    printf("# instances: %u\n",(ulong)scene_00->num_instances);
    for (instance._4_4_ = 0; instance._4_4_ < scene_00->num_instances;
        instance._4_4_ = instance._4_4_ + 1) {
      poVar4 = scene_00->instances + instance._4_4_;
      if (poVar4->layer_index == 0xffffffff) {
        local_b8 = "(no layer)";
      }
      else {
        if (scene_00->layers[poVar4->layer_index].name == (char *)0x0) {
          local_c0 = "";
        }
        else {
          local_c0 = scene_00->layers[poVar4->layer_index].name;
        }
        local_b8 = local_c0;
      }
      if (poVar4->name == (char *)0x0) {
        local_d0 = "";
      }
      else {
        local_d0 = poVar4->name;
      }
      in_stack_ffffffffffffff20 = "shown";
      if ((poVar4->hidden & 1U) != 0) {
        in_stack_ffffffffffffff20 = "hidden";
      }
      printf("instance[%u,name=%s] at position (%.0f,%.0f,%.0f) uses model %u and is in layer[%u, name=\'%s\'], group %u, and is %s\n"
             ,(double)(poVar4->transform).m30,(double)(poVar4->transform).m31,
             (double)(poVar4->transform).m32,(ulong)instance._4_4_,local_d0,
             (ulong)poVar4->model_index,(ulong)poVar4->layer_index,local_b8,poVar4->group_index,
             in_stack_ffffffffffffff20);
    }
    printf("# models: %u\n",(ulong)scene_00->num_models);
    for (model_1._4_4_ = 0; uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff20 >> 0x20),
        model_1._4_4_ < scene_00->num_models; model_1._4_4_ = model_1._4_4_ + 1) {
      model_00 = scene_00->models[model_1._4_4_];
      uVar2 = count_solid_voxels_in_model(model_00);
      in_stack_ffffffffffffff20 = (char *)CONCAT44(uVar6,model_00->voxel_hash);
      printf(" model[%u] has dimension %ux%ux%u, with %u solid voxels of the total %u voxels (hash=%u)!\n"
             ,(ulong)model_1._4_4_,(ulong)model_00->size_x,(ulong)model_00->size_y,
             (ulong)model_00->size_z,(ulong)uVar2,
             model_00->size_x * model_00->size_y * model_00->size_z,in_stack_ffffffffffffff20);
    }
    save_vox_scene("saved.vox",scene_00);
    ogt_vox_destroy_scene(scene_00);
    filename_local._7_1_ = true;
  }
  return filename_local._7_1_;
}

Assistant:

bool demo_load_and_save(const char *filename)
{
    const ogt_vox_scene* scene = load_vox_scene_with_groups(filename);
    if (scene)
    {
        printf("#layers: %u\n", scene->num_layers);
        for (uint32_t layer_index = 0; layer_index < scene->num_layers; layer_index++)
        {
            const ogt_vox_layer* layer = &scene->layers[layer_index];
            printf("layer[%u,name=%s] is %s\n",
                layer_index,
                layer->name ? layer->name : "",
                layer->hidden ? "hidden" : "shown");
        }
        printf("#groups: %u\n", scene->num_groups);
        for (uint32_t group_index = 0; group_index < scene->num_groups; group_index++)
        {
            const ogt_vox_group* group = &scene->groups[group_index];
            const ogt_vox_layer* group_layer = group->layer_index != UINT32_MAX ? &scene->layers[group->layer_index] : NULL;
            printf("group[%u] has parent group %u, is part of layer[%u,name=%s] and is %s\n", 
                group_index, 
                group->parent_group_index,
                group->layer_index,
                group_layer && group_layer->name ? group_layer->name : "",
                group->hidden ? "hidden" : "shown");
        }
            
        // iterate over all instances - and print basic information about the instance and the model that it references
        printf("# instances: %u\n", scene->num_instances);
        for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++)
        {
            const ogt_vox_instance* instance = &scene->instances[instance_index];
            const ogt_vox_model* model = scene->models[instance->model_index];
            
            const char* layer_name =
                instance->layer_index == UINT32_MAX ? "(no layer)":
                scene->layers[instance->layer_index].name ? scene->layers[instance->layer_index].name : 
                "";

            printf("instance[%u,name=%s] at position (%.0f,%.0f,%.0f) uses model %u and is in layer[%u, name='%s'], group %u, and is %s\n",
                instance_index,
                instance->name ? instance->name : "",
                instance->transform.m30, instance->transform.m31, instance->transform.m32, // translation components of the instance
                instance->model_index,
                instance->layer_index,
                layer_name,
                instance->group_index,
                instance->hidden ? "hidden" : "shown");
        }
        // iterate over all models and print basic information about the model.
        printf("# models: %u\n", scene->num_models);
        for (uint32_t model_index = 0; model_index < scene->num_models; model_index++)
        {
            const ogt_vox_model* model = scene->models[model_index];

            uint32_t solid_voxel_count = count_solid_voxels_in_model(model);
            uint32_t total_voxel_count = model->size_x * model->size_y * model->size_z;

            printf(" model[%u] has dimension %ux%ux%u, with %u solid voxels of the total %u voxels (hash=%u)!\n",
                model_index,
                model->size_x, model->size_y, model->size_z,
                solid_voxel_count,
                total_voxel_count,
                model->voxel_hash);
        }

        save_vox_scene("saved.vox", scene); 

        ogt_vox_destroy_scene(scene);
        return true;
    }
    fprintf(stderr, "Failed to load %s\n", filename);
    return false;
}